

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitSVTest_single_word_prefix_delim_Test<char>::SplitSVTest_single_word_prefix_delim_Test
          (SplitSVTest_single_word_prefix_delim_Test<char> *this)

{
  SplitSVTest_single_word_prefix_delim_Test<char> *this_local;
  
  SplitSVTest<char>::SplitSVTest(&this->super_SplitSVTest<char>);
  *(undefined ***)&this->super_SplitSVTest<char> =
       &PTR__SplitSVTest_single_word_prefix_delim_Test_00819d40;
  return;
}

Assistant:

TYPED_TEST(SplitSVTest, single_word_prefix_delim) {
	std::basic_string<TypeParam> word;
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>();
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 2);
	EXPECT_EQ(split_result[0].size(), 0);
	EXPECT_EQ(split_result[1].size(), 8);
}